

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O1

int randomx_argon2_fill_memory_blocks(argon2_instance_t *instance)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong unaff_R14;
  ulong uVar4;
  argon2_position_t aVar5;
  ulong local_38;
  
  iVar1 = -0x19;
  if ((instance != (argon2_instance_t *)0x0) && (iVar1 = -0x19, instance->lanes != 0)) {
    if (instance->passes != 0) {
      local_38 = 0;
      do {
        uVar2 = 0;
        do {
          if (instance->lanes != 0) {
            uVar3 = 0;
            uVar4 = local_38;
            do {
              unaff_R14 = (uint)unaff_R14 & 0xffffff00 | uVar2;
              aVar5.slice = (char)unaff_R14;
              aVar5._9_3_ = (int3)(unaff_R14 >> 8);
              aVar5.index = (int)(unaff_R14 >> 0x20);
              aVar5.pass = (int)uVar4;
              aVar5.lane = (int)(uVar4 >> 0x20);
              (*instance->impl)(instance,aVar5);
              uVar3 = uVar3 + 1;
              uVar4 = uVar4 + 0x100000000;
            } while (uVar3 < instance->lanes);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != 4);
        local_38 = local_38 + 1;
      } while (local_38 < instance->passes);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int randomx_argon2_fill_memory_blocks(argon2_instance_t *instance) {
	if (instance == NULL || instance->lanes == 0) {
		return ARGON2_INCORRECT_PARAMETER;
	}
	return fill_memory_blocks_st(instance);
}